

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int add_ranges_from_ranges
              (backtrace_state *state,dwarf_sections *dwarf_sections,
              libbacktrace_base_address base_address,int is_bigendian,unit *u,uintptr_t base,
              pcrange *pcrange,
              _func_int_backtrace_state_ptr_void_ptr_uintptr_t_uintptr_t_backtrace_error_callback_void_ptr_void_ptr
              *add_range,void *rdata,backtrace_error_callback error_callback,void *data,void *vec)

{
  int iVar1;
  uint64_t address;
  uintptr_t uVar2;
  uintptr_t rh;
  uintptr_t rl;
  uint64_t high;
  uint64_t low;
  dwarf_buf ranges_buf;
  uintptr_t base_local;
  unit *u_local;
  int is_bigendian_local;
  dwarf_sections *dwarf_sections_local;
  backtrace_state *state_local;
  libbacktrace_base_address base_address_local;
  
  if (pcrange->ranges < dwarf_sections->size[3]) {
    low = (uint64_t)anon_var_dwarf_64b7d;
    ranges_buf.name = (char *)dwarf_sections->data[3];
    ranges_buf.start = dwarf_sections->data[3] + pcrange->ranges;
    ranges_buf.buf = (uchar *)(dwarf_sections->size[3] - pcrange->ranges);
    ranges_buf._32_8_ = error_callback;
    ranges_buf.error_callback = (backtrace_error_callback)data;
    ranges_buf.data._0_4_ = 0;
    ranges_buf.left._0_4_ = is_bigendian;
    uVar2 = base;
    do {
      ranges_buf._56_8_ = uVar2;
      if ((int)ranges_buf.data != 0) {
        return 0;
      }
      address = read_address((dwarf_buf *)&low,u->addrsize);
      uVar2 = read_address((dwarf_buf *)&low,u->addrsize);
      if ((address == 0) && (uVar2 == 0)) {
        if ((int)ranges_buf.data == 0) {
          return 1;
        }
        return 0;
      }
      iVar1 = is_highest_address(address,u->addrsize);
    } while ((iVar1 != 0) ||
            (iVar1 = (*add_range)(state,rdata,address + ranges_buf._56_8_ + base_address.m,
                                  uVar2 + ranges_buf._56_8_ + base_address.m,error_callback,data,vec
                                 ), uVar2 = ranges_buf._56_8_, iVar1 != 0));
  }
  else {
    ranges_buf._56_8_ = base;
    (*error_callback)(data,"ranges offset out of range",0);
  }
  return 0;
}

Assistant:

static int
add_ranges_from_ranges (
    struct backtrace_state *state,
    const struct dwarf_sections *dwarf_sections,
    struct libbacktrace_base_address base_address, int is_bigendian,
    struct unit *u, uintptr_t base,
    const struct pcrange *pcrange,
    int (*add_range) (struct backtrace_state *state, void *rdata,
		      uintptr_t lowpc, uintptr_t highpc,
		      backtrace_error_callback error_callback, void *data,
		      void *vec),
    void *rdata,
    backtrace_error_callback error_callback, void *data,
    void *vec)
{
  struct dwarf_buf ranges_buf;

  if (pcrange->ranges >= dwarf_sections->size[DEBUG_RANGES])
    {
      error_callback (data, "ranges offset out of range", 0);
      return 0;
    }

  ranges_buf.name = ".debug_ranges";
  ranges_buf.start = dwarf_sections->data[DEBUG_RANGES];
  ranges_buf.buf = dwarf_sections->data[DEBUG_RANGES] + pcrange->ranges;
  ranges_buf.left = dwarf_sections->size[DEBUG_RANGES] - pcrange->ranges;
  ranges_buf.is_bigendian = is_bigendian;
  ranges_buf.error_callback = error_callback;
  ranges_buf.data = data;
  ranges_buf.reported_underflow = 0;

  while (1)
    {
      uint64_t low;
      uint64_t high;

      if (ranges_buf.reported_underflow)
	return 0;

      low = read_address (&ranges_buf, u->addrsize);
      high = read_address (&ranges_buf, u->addrsize);

      if (low == 0 && high == 0)
	break;

      if (is_highest_address (low, u->addrsize))
	base = (uintptr_t) high;
      else
	{
	  uintptr_t rl, rh;

	  rl = libbacktrace_add_base ((uintptr_t) low + base, base_address);
	  rh = libbacktrace_add_base ((uintptr_t) high + base, base_address);
	  if (!add_range (state, rdata, rl, rh, error_callback, data, vec))
	    return 0;
	}
    }

  if (ranges_buf.reported_underflow)
    return 0;

  return 1;
}